

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O0

string * __thiscall cppcms::rpc::json_call::method_abi_cxx11_(json_call *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x30));
  return in_RDI;
}

Assistant:

std::string json_call::method()
	{
		return method_;
	}